

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

DistConstraintListSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DistConstraintListSyntax,slang::syntax::DistConstraintListSyntax_const&>
          (BumpAllocator *this,DistConstraintListSyntax *args)

{
  SyntaxNode *pSVar1;
  Info *pIVar2;
  Info *pIVar3;
  size_t sVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  DistConstraintListSyntax *pDVar13;
  
  pDVar13 = (DistConstraintListSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DistConstraintListSyntax *)this->endPtr < pDVar13 + 1) {
    pDVar13 = (DistConstraintListSyntax *)allocateSlow(this,0x80,8);
  }
  else {
    this->head->current = (byte *)(pDVar13 + 1);
  }
  (pDVar13->super_SyntaxNode).previewNode = (args->super_SyntaxNode).previewNode;
  uVar5 = *(undefined4 *)&(args->super_SyntaxNode).field_0x4;
  pSVar1 = (args->super_SyntaxNode).parent;
  (pDVar13->super_SyntaxNode).kind = (args->super_SyntaxNode).kind;
  *(undefined4 *)&(pDVar13->super_SyntaxNode).field_0x4 = uVar5;
  (pDVar13->super_SyntaxNode).parent = pSVar1;
  uVar6 = (args->dist).field_0x2;
  NVar7.raw = (args->dist).numFlags.raw;
  uVar8 = (args->dist).rawLen;
  pIVar2 = (args->dist).info;
  TVar9 = (args->openBrace).kind;
  uVar10 = (args->openBrace).field_0x2;
  NVar11.raw = (args->openBrace).numFlags.raw;
  uVar12 = (args->openBrace).rawLen;
  pIVar3 = (args->openBrace).info;
  (pDVar13->dist).kind = (args->dist).kind;
  (pDVar13->dist).field_0x2 = uVar6;
  (pDVar13->dist).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar13->dist).rawLen = uVar8;
  (pDVar13->dist).info = pIVar2;
  (pDVar13->openBrace).kind = TVar9;
  (pDVar13->openBrace).field_0x2 = uVar10;
  (pDVar13->openBrace).numFlags = (NumericTokenFlags)NVar11.raw;
  (pDVar13->openBrace).rawLen = uVar12;
  (pDVar13->openBrace).info = pIVar3;
  (pDVar13->items).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->items).super_SyntaxListBase.super_SyntaxNode.previewNode;
  uVar5 = *(undefined4 *)&(args->items).super_SyntaxListBase.super_SyntaxNode.field_0x4;
  pSVar1 = (args->items).super_SyntaxListBase.super_SyntaxNode.parent;
  (pDVar13->items).super_SyntaxListBase.super_SyntaxNode.kind =
       (args->items).super_SyntaxListBase.super_SyntaxNode.kind;
  *(undefined4 *)&(pDVar13->items).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar5;
  (pDVar13->items).super_SyntaxListBase.super_SyntaxNode.parent = pSVar1;
  (pDVar13->items).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_002f8690;
  (pDVar13->items).super_SyntaxListBase.childCount = (args->items).super_SyntaxListBase.childCount;
  (pDVar13->items).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_002f9150;
  sVar4 = (args->items).elements._M_extent._M_extent_value;
  (pDVar13->items).elements._M_ptr = (args->items).elements._M_ptr;
  (pDVar13->items).elements._M_extent._M_extent_value = sVar4;
  uVar6 = (args->closeBrace).field_0x2;
  NVar7.raw = (args->closeBrace).numFlags.raw;
  uVar8 = (args->closeBrace).rawLen;
  pIVar2 = (args->closeBrace).info;
  (pDVar13->closeBrace).kind = (args->closeBrace).kind;
  (pDVar13->closeBrace).field_0x2 = uVar6;
  (pDVar13->closeBrace).numFlags = (NumericTokenFlags)NVar7.raw;
  (pDVar13->closeBrace).rawLen = uVar8;
  (pDVar13->closeBrace).info = pIVar2;
  return pDVar13;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }